

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_list(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int n_l;
  int test_ret_1;
  int test_ret_16;
  bool bVar11;
  int test_ret;
  int test_ret_2;
  int test_ret_4;
  int test_ret_3;
  int test_ret_6;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing list : 19 of 26 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlLinkGetData(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlLinkGetData",(ulong)(uint)(iVar3 - iVar1));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar10 = 0;
  do {
    iVar3 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListAppend();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListAppend",(ulong)(uint)(iVar5 - iVar4));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  function_tests = function_tests + 1;
  iVar3 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (iVar3 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListClear();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListClear",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 == 1);
  function_tests = function_tests + 1;
  local_40 = 0;
  iVar3 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (iVar3 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListCopy();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListCopy",(ulong)(uint)(iVar6 - iVar5));
      local_40 = local_40 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 == 1);
  function_tests = function_tests + 1;
  iVar3 = 0;
  local_38 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (iVar3 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListEmpty();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListEmpty",(ulong)(uint)(iVar6 - iVar5));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 == 1);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar10 = 0;
  do {
    iVar3 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListInsert();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListInsert",(ulong)(uint)(iVar6 - iVar5));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar1 = local_44 + (uint)(iVar1 != iVar2) + iVar4 + local_40;
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      if (iVar2 == 0) {
        lVar8 = xmlListCreate(0,0);
      }
      else {
        lVar8 = 0;
      }
      xmlListMerge();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      if (lVar8 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListMerge",(ulong)(uint)(iVar4 - iVar3));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 == 1);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar1 = iVar1 + local_38;
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_34 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListPopBack();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListPopBack",(ulong)(uint)(iVar4 - iVar3));
      local_34 = local_34 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_38 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListPopFront();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListPopFront",(ulong)(uint)(iVar4 - iVar3));
      local_38 = local_38 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  iVar1 = iVar1 + local_3c + local_40;
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListPushBack();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListPushBack",(ulong)(uint)(iVar4 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListPushFront();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListPushFront",(ulong)(uint)(iVar4 - iVar3));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar1 = iVar1 + local_34 + local_38;
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListRemoveAll();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListRemoveAll",(ulong)(uint)(iVar4 - iVar3));
        local_38 = local_38 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar1 = iVar1 + local_3c;
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListRemoveFirst();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListRemoveFirst",(ulong)(uint)(iVar4 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar1 = iVar1 + local_40;
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListRemoveLast();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListRemoveLast",(ulong)(uint)(iVar4 - iVar3));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListReverse();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListReverse",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  iVar1 = iVar1 + local_38 + local_3c;
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListReverseSearch();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListReverseSearch",(ulong)(uint)(iVar5 - iVar4));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  iVar1 = iVar1 + local_40;
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar10 = 0;
  do {
    iVar2 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar10 == 0) {
        lVar9 = xmlListCreate(0,0);
      }
      else {
        lVar9 = 0;
      }
      xmlListSearch();
      call_tests = call_tests + 1;
      if (lVar9 != 0) {
        xmlListDelete();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListSearch",(ulong)(uint)(iVar5 - iVar4));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar10);
        printf(" %d");
        putchar(10);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar11 = uVar10 == 0;
    uVar10 = uVar10 + 1;
  } while (bVar11);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListSize();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListSize",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (iVar2 == 0) {
      lVar9 = xmlListCreate(0,0);
    }
    else {
      lVar9 = 0;
    }
    xmlListSort();
    call_tests = call_tests + 1;
    if (lVar9 != 0) {
      xmlListDelete();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlListSort",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      putchar(10);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 == 1);
  function_tests = function_tests + 1;
  uVar10 = iVar1 + iVar3 + local_3c + local_40 + iVar4 + iVar5;
  if (uVar10 != 0) {
    printf("Module list: %d errors\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

static int
test_list(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing list : 19 of 26 functions ...\n");
    test_ret += test_xmlLinkGetData();
    test_ret += test_xmlListAppend();
    test_ret += test_xmlListClear();
    test_ret += test_xmlListCopy();
    test_ret += test_xmlListCreate();
    test_ret += test_xmlListDup();
    test_ret += test_xmlListEmpty();
    test_ret += test_xmlListEnd();
    test_ret += test_xmlListFront();
    test_ret += test_xmlListInsert();
    test_ret += test_xmlListMerge();
    test_ret += test_xmlListPopBack();
    test_ret += test_xmlListPopFront();
    test_ret += test_xmlListPushBack();
    test_ret += test_xmlListPushFront();
    test_ret += test_xmlListRemoveAll();
    test_ret += test_xmlListRemoveFirst();
    test_ret += test_xmlListRemoveLast();
    test_ret += test_xmlListReverse();
    test_ret += test_xmlListReverseSearch();
    test_ret += test_xmlListReverseWalk();
    test_ret += test_xmlListSearch();
    test_ret += test_xmlListSize();
    test_ret += test_xmlListSort();
    test_ret += test_xmlListWalk();

    if (test_ret != 0)
	printf("Module list: %d errors\n", test_ret);
    return(test_ret);
}